

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

TestCaseGroup * deqp::gles31::Functional::createDrawBuffersIndexedTests(Context *context)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  uint uVar3;
  TestCaseGroup *this;
  TestCaseGroup *root;
  TestCaseGroup *root_00;
  TestNode *pTVar4;
  TestNode *node;
  TestNode *node_00;
  uint uVar5;
  BlendState emptyState;
  Maybe<bool> local_260;
  long local_250 [2];
  undefined1 local_240 [32];
  anon_union_8_2_d0736028_for_Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_5
  local_220 [2];
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_210 [2];
  ios_base local_1a0 [264];
  BlendState local_98;
  
  local_260.m_ptr = (bool *)0x0;
  local_240._0_8_ =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  local_210[0].m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_220[0].m_align = 0;
  anon_unknown_0::BlendState::BlendState
            (&local_98,&local_260,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_240,local_210,(Maybe<tcu::Vector<bool,_4>_> *)local_220);
  this = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"draw_buffers_indexed",
             "Test for indexed draw buffers. GL_EXT_draw_buffers_indexed.");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  this->m_context = context;
  root = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)root,context->m_testCtx,"overwrite_common",
             "Set common state and overwrite it with draw buffer blend state.");
  (root->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  root->m_context = context;
  root_00 = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)root_00,context->m_testCtx,"overwrite_indexed",
             "Set indexed blend state and overwrite it with common state.");
  (root_00->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_021985d0;
  root_00->m_context = context;
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"random","Random indexed blend state tests."
            );
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  node = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,context->m_testCtx,"max_required_draw_buffers",
             "Random tests using minimum maximum number of draw buffers.");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  node[1]._vptr_TestNode = (_func_int **)context;
  node_00 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,context->m_testCtx,"max_implementation_draw_buffers",
             "Random tests using maximum number of draw buffers reported by implementation.");
  node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  node_00[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)root);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)root_00);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  tcu::TestNode::addChild(pTVar4,node);
  tcu::TestNode::addChild(pTVar4,node_00);
  anon_unknown_0::addDrawBufferCommonTests(root,PRE);
  anon_unknown_0::addDrawBufferCommonTests(root_00,POST);
  uVar5 = 0;
  do {
    pTVar4 = (TestNode *)operator_new(0x80);
    pp_Var1 = node[1]._vptr_TestNode;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    std::ostream::operator<<(local_210,uVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
    std::ios_base::~ios_base(local_1a0);
    uVar2 = local_240._0_8_;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    std::ostream::operator<<(local_210,uVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
    std::ios_base::~ios_base(local_1a0);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,(TestContext *)*pp_Var1,(char *)uVar2,local_260.m_ptr);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02198670;
    pTVar4[1]._vptr_TestNode = pp_Var1;
    if (local_260.m_ptr != (bool *)local_250) {
      operator_delete(local_260.m_ptr,local_250[0] + 1);
    }
    if ((Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        local_240._0_8_ !=
        (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        (local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ad430;
    uVar3 = (uVar5 ^ 0x3d) * 9;
    uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
    *(uint *)&pTVar4[1].m_testCtx = uVar3 >> 0xf ^ uVar3 ^ 0x5cdd369b;
    tcu::TestNode::addChild(node,pTVar4);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  uVar5 = 0;
  do {
    pTVar4 = (TestNode *)operator_new(0x80);
    pp_Var1 = node_00[1]._vptr_TestNode;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    std::ostream::operator<<(local_210,uVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
    std::ios_base::~ios_base(local_1a0);
    uVar2 = local_240._0_8_;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    std::ostream::operator<<(local_210,uVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
    std::ios_base::~ios_base(local_1a0);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,(TestContext *)*pp_Var1,(char *)uVar2,local_260.m_ptr);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02198670;
    pTVar4[1]._vptr_TestNode = pp_Var1;
    if (local_260.m_ptr != (bool *)local_250) {
      operator_delete(local_260.m_ptr,local_250[0] + 1);
    }
    if ((Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        local_240._0_8_ !=
        (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        (local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ad480;
    uVar3 = (uVar5 ^ 0x3d) * 9;
    uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
    *(uint *)&pTVar4[1].m_testCtx = uVar3 >> 0xf ^ uVar3 ^ 0xa01decda;
    tcu::TestNode::addChild(node_00,pTVar4);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  if (local_98.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_98.blendFunc.m_ptr)->m_isFirst = true;
    ((local_98.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_98.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_98.blendEq.m_ptr)->m_isFirst = true;
    ((local_98.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  return this;
}

Assistant:

TestCaseGroup* createDrawBuffersIndexedTests (Context& context)
{
	const BlendState		emptyState		= BlendState(Maybe<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
	TestCaseGroup* const	group			= new TestCaseGroup(context, "draw_buffers_indexed", "Test for indexed draw buffers. GL_EXT_draw_buffers_indexed.");

	TestCaseGroup* const	preGroup		= new TestCaseGroup(context, "overwrite_common", "Set common state and overwrite it with draw buffer blend state.");
	TestCaseGroup* const	postGroup		= new TestCaseGroup(context, "overwrite_indexed", "Set indexed blend state and overwrite it with common state.");
	TestCaseGroup* const	randomGroup		= new TestCaseGroup(context, "random", "Random indexed blend state tests.");
	TestCaseGroup* const	maxGroup		= new TestCaseGroup(context, "max_required_draw_buffers", "Random tests using minimum maximum number of draw buffers.");
	TestCaseGroup* const	maxImplGroup	= new TestCaseGroup(context, "max_implementation_draw_buffers", "Random tests using maximum number of draw buffers reported by implementation.");

	group->addChild(preGroup);
	group->addChild(postGroup);
	group->addChild(randomGroup);

	randomGroup->addChild(maxGroup);
	randomGroup->addChild(maxImplGroup);

	addDrawBufferCommonTests(preGroup, PRE);
	addDrawBufferCommonTests(postGroup, POST);
	addRandomMaxTest(maxGroup);
	addRandomImplMaxTest(maxImplGroup);

	return group;
}